

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall Player::Logout(Player *this)

{
  uint uVar1;
  World *pWVar2;
  bool bVar3;
  reference ppCVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  string *__return_storage_ptr__;
  IPAddress local_74;
  string local_70;
  Database_Result local_50;
  Character *local_30;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  Player *this_local;
  
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&character);
    if (!bVar3) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    local_30 = *ppCVar4;
    if (local_30 != (Character *)0x0) {
      (*(local_30->super_Command_Source)._vptr_Command_Source[8])();
    }
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  std::vector<Character_*,_std::allocator<Character_*>_>::clear(&this->characters);
  if (this->client != (EOClient *)0x0) {
    pWVar2 = this->world;
    uVar5 = time((time_t *)0x0);
    uVar1 = this->client->hdid;
    local_74 = Client::GetRemoteAddr(&this->client->super_Client);
    __return_storage_ptr__ = &local_70;
    IPAddress::operator_cast_to_string(__return_storage_ptr__,&local_74);
    uVar6 = std::__cxx11::string::c_str();
    uVar7 = std::__cxx11::string::c_str();
    Database::Query(&local_50,&pWVar2->db,
                    "UPDATE `accounts` SET `lastused` = #, `hdid` = #, `lastip` = \'$\' WHERE username = \'$\'"
                    ,uVar5 & 0xffffffff,(ulong)uVar1,uVar6,uVar7,__return_storage_ptr__);
    Database_Result::~Database_Result(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    Client::Close(&this->client->super_Client,false);
    this->client->player = (Player *)0x0;
    this->client = (EOClient *)0x0;
  }
  return;
}

Assistant:

void Player::Logout()
{
	UTIL_FOREACH(this->characters, character)
	{
		delete character;
	}
	this->characters.clear();

	if (this->client)
	{
#ifdef DEBUG
		Console::Dbg("Saving player '%s' (session lasted %i minutes)", this->username.c_str(), int(std::time(0) - this->login_time) / 60);
#endif // DEBUG
		this->world->db.Query("UPDATE `accounts` SET `lastused` = #, `hdid` = #, `lastip` = '$' WHERE username = '$'", int(std::time(0)), this->client->hdid, static_cast<std::string>(this->client->GetRemoteAddr()).c_str(), this->username.c_str());

		// Disconnect the client to make sure this null pointer is never dereferenced
		this->client->Close();
		this->client->player = nullptr;
		this->client = nullptr; // Not reference counted!
	}
}